

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O1

VmValue * anon_unknown.dwarf_13465d::CreateLoad
                    (ExpressionContext *ctx,VmModule *module,SynBase *source,TypeBase *type,
                    VmValue *address,uint offset)

{
  uint uVar1;
  ulong size;
  Allocator *pAVar2;
  VariableData *pVVar3;
  VmConstant **ppVVar4;
  int iVar5;
  VmInstructionType VVar6;
  VmConstant *pVVar7;
  undefined4 extraout_var;
  VmInstruction *pVVar9;
  SynBase *source_00;
  VmType VVar10;
  int in_stack_ffffffffffffffa8;
  VmValue *pVVar11;
  VmConstant *pVVar8;
  
  size = type->size;
  if (size == 0) {
    pVVar7 = CreateConstantStruct(ctx->allocator,source,(char *)0x0,0,type);
    return &pVVar7->super_VmValue;
  }
  if (0x40 < (long)size) {
    pVVar7 = CreateAlloca(ctx,module,source,type,"spill",true);
    CreateMemCopy(module,source,&pVVar7->super_VmValue,0,address,(uint)type->size,
                  in_stack_ffffffffffffffa8);
    iVar5 = (*module->allocator->_vptr_Allocator[2])(module->allocator,0xd8);
    pVVar8 = (VmConstant *)CONCAT44(extraout_var,iVar5);
    pAVar2 = ctx->allocator;
    VVar10 = GetVmType(ctx,type);
    (pVVar8->super_VmValue).typeID = 1;
    (pVVar8->super_VmValue).type = VVar10;
    (pVVar8->super_VmValue).source = source;
    (pVVar8->super_VmValue).comment.begin = (char *)0x0;
    (pVVar8->super_VmValue).comment.end = (char *)0x0;
    (pVVar8->super_VmValue).users.allocator = pAVar2;
    (pVVar8->super_VmValue).users.data = (pVVar8->super_VmValue).users.little;
    (pVVar8->super_VmValue).users.count = 0;
    (pVVar8->super_VmValue).users.max = 8;
    (pVVar8->super_VmValue).hasSideEffects = false;
    (pVVar8->super_VmValue).hasMemoryAccess = false;
    (pVVar8->super_VmValue).canBeRemoved = true;
    (pVVar8->super_VmValue).hasKnownSimpleUse = false;
    (pVVar8->super_VmValue).hasKnownNonSimpleUse = false;
    (pVVar8->super_VmValue)._vptr_VmValue = (_func_int **)&PTR__VmValue_00249d38;
    pVVar8->iValue = 0;
    pVVar8->dValue = 0.0;
    pVVar8->lValue = 0;
    pVVar8->sValue = (char *)0x0;
    pVVar8->bValue = (VmBlock *)0x0;
    pVVar8->fValue = (VmFunction *)0x0;
    pVVar8->container = (VariableData *)0x0;
    pVVar8->isFloat = false;
    pVVar8->isReference = false;
    pVVar8->iValue = pVVar7->iValue;
    pVVar3 = pVVar7->container;
    pVVar8->container = pVVar3;
    pVVar8->isReference = true;
    uVar1 = (pVVar3->users).count;
    if (uVar1 == (pVVar3->users).max) {
      SmallArray<VmConstant_*,_8U>::grow(&pVVar3->users,uVar1);
    }
    ppVVar4 = (pVVar3->users).data;
    if (ppVVar4 != (VmConstant **)0x0) {
      uVar1 = (pVVar3->users).count;
      (pVVar3->users).count = uVar1 + 1;
      ppVVar4[uVar1] = pVVar8;
      return &pVVar8->super_VmValue;
    }
    __assert_fail("data",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                  ,0x162,
                  "void SmallArray<VmConstant *, 8>::push_back(const T &) [T = VmConstant *, N = 8]"
                 );
  }
  if ((((ctx->typeBool == type) || (ctx->typeChar == type)) || (ctx->typeShort == type)) ||
     (ctx->typeInt == type)) {
LAB_001ad0e6:
    source_00 = (SynBase *)0x400000001;
    pVVar11 = (VmValue *)0x0;
  }
  else {
    source_00 = (SynBase *)0x800000002;
    pVVar11 = (VmValue *)0x0;
    if ((ctx->typeFloat == type) || (source_00 = (SynBase *)0x800000002, ctx->typeDouble == type))
    goto LAB_001ad0e9;
    if (ctx->typeLong == type) {
      source_00 = (SynBase *)0x800000003;
      pVVar11 = (VmValue *)0x0;
      goto LAB_001ad0e9;
    }
    pVVar11 = (VmValue *)type;
    if (type != (TypeBase *)0x0) {
      uVar1 = type->typeID;
      if (uVar1 == 0x12) {
        source_00 = (SynBase *)0x800000006;
        goto LAB_001ad0e9;
      }
      if (uVar1 == 0x14) {
        source_00 = (SynBase *)0xc00000008;
        goto LAB_001ad0e9;
      }
      if (uVar1 == 0x15) {
        source_00 = (SynBase *)0xc00000007;
        goto LAB_001ad0e9;
      }
    }
    if (ctx->typeAutoRef == (TypeStruct *)type) {
      source_00 = (SynBase *)0xc00000009;
    }
    else {
      if (ctx->typeAutoArray != (TypeStruct *)type) {
        if (type != (TypeBase *)0x0) {
          uVar1 = type->typeID;
          if (uVar1 - 9 < 2) goto LAB_001ad0e6;
          source_00 = (SynBase *)0x400000001;
          pVVar11 = (VmValue *)0x0;
          if ((uVar1 == 0x19) ||
             (source_00 = (SynBase *)0x800000006, pVVar11 = (VmValue *)type, uVar1 == 0xb))
          goto LAB_001ad0e9;
        }
        if ((size & 3) != 0) {
          __assert_fail("type->size % 4 == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                        ,0x1e2,
                        "VmType (anonymous namespace)::GetLoadResultType(ExpressionContext &, TypeBase *)"
                       );
        }
        VVar10 = VmType::Struct(size,type);
        source_00 = VVar10._0_8_;
        pVVar11 = (VmValue *)VVar10.structType;
        goto LAB_001ad0e9;
      }
      source_00 = (SynBase *)0x100000000a;
    }
    pVVar11 = (VmValue *)0x0;
  }
LAB_001ad0e9:
  VVar6 = GetLoadInstruction(ctx,type);
  pVVar7 = CreateConstantInt(ctx->allocator,source,0);
  VVar10.structType._0_4_ = VVar6;
  VVar10._0_8_ = pVVar11;
  VVar10.structType._4_4_ = 0;
  pVVar9 = CreateInstruction((anon_unknown_dwarf_13465d *)module,(VmModule *)source,source_00,VVar10
                             ,(VmInstructionType)address,&pVVar7->super_VmValue,(VmValue *)0x0,
                             (VmValue *)0x0,(VmValue *)0x0,pVVar11);
  return &pVVar9->super_VmValue;
}

Assistant:

VmValue* CreateLoad(ExpressionContext &ctx, VmModule *module, SynBase *source, TypeBase *type, VmValue *address, unsigned offset)
	{
		if(type->size == 0)
			return CreateConstantStruct(ctx.allocator, source, NULL, 0, type);

		if(type->size > spillTypeSize)
		{
			VmConstant *spill = CreateAlloca(ctx, module, source, type, "spill", true);

			CreateMemCopy(module, source, spill, 0, address, offset, (int)type->size);

			VmConstant *reference = new (module->get<VmConstant>()) VmConstant(ctx.allocator, GetVmType(ctx, type), source);

			reference->iValue = spill->iValue;
			reference->container = spill->container;
			reference->isReference = true;

			reference->container->users.push_back(reference);

			return reference;
		}

		return CreateInstruction(module, source, GetLoadResultType(ctx, type), GetLoadInstruction(ctx, type), address, CreateConstantInt(ctx.allocator, source, offset));
	}